

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::blitFramebuffer
          (ReferenceContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,
          int dstX1,int dstY1,deUint32 mask,deUint32 filter)

{
  ChannelOrder CVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  TextureFormat format;
  ChannelOrder CVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TextureChannelClass TVar12;
  float *pfVar13;
  ChannelType *pCVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  ReferenceContext *pRVar23;
  byte bVar24;
  float fVar25;
  float fVar26;
  undefined4 uVar27;
  IVec4 local_188;
  IVec4 local_178;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  ReferenceContext *local_158;
  float local_150;
  float local_14c;
  Matrix<float,_3,_3> res;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src_1;
  Matrix<float,_3,_3> res_1;
  undefined4 uStack_84;
  Vec4 local_78;
  Mat3 transform;
  
  fVar21 = (float)(dstY1 - dstY0);
  local_188.m_data[1] = dstY0;
  if (dstY1 < dstY0) {
    local_188.m_data[1] = dstY1;
  }
  local_168 = (float)(dstX1 - dstX0);
  local_188.m_data[0] = dstX0;
  if (dstX1 < dstX0) {
    local_188.m_data[0] = dstX1;
  }
  local_15c = (float)(srcY1 - srcY0);
  fVar22 = (float)srcY0;
  if (srcY1 < srcY0) {
    fVar22 = (float)srcY1;
  }
  local_160 = (float)(srcX1 - srcX0);
  fVar25 = (float)srcX0;
  if (srcX1 < srcX0) {
    fVar25 = (float)srcX1;
  }
  fVar26 = (float)-(int)local_160;
  if (0 < (int)local_160) {
    fVar26 = local_160;
  }
  fVar2 = (float)-(int)local_15c;
  if (0 < (int)local_15c) {
    fVar2 = local_15c;
  }
  local_188.m_data[2] = -(int)local_168;
  if (0 < (int)local_168) {
    local_188.m_data[2] = (int)local_168;
  }
  fVar3 = (float)-(int)fVar21;
  if (0 < (int)fVar21) {
    fVar3 = fVar21;
  }
  bVar7 = fVar26 != (float)local_188.m_data[2];
  if (filter - 0x2602 < 0xfffffffe) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  local_158 = this;
  if ((mask & 0x500) != 0 && filter != 0x2600) goto LAB_008295d6;
  local_188.m_data[3] = (int)fVar3;
  local_178.m_data[0] = (int)fVar25;
  local_178.m_data[1] = (int)fVar22;
  local_178.m_data[2] = (int)fVar26;
  local_178.m_data[3] = (int)fVar2;
  local_164 = (float)srcX1;
  local_150 = (float)srcY1;
  local_14c = (float)dstX0;
  iVar9 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
  if (((iVar9 != 0x8cd5) ||
      (iVar9 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca8), iVar9 != 0x8cd5)) ||
     (getDrawColorbuffer((MultisamplePixelBufferAccess *)&src_1,this),
     src_1.m_access.m_size.m_data[0] != 1)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
  pRVar23 = local_158;
  if (src_1.m_access.m_size.m_data[0] != 1) {
    if (fVar2 != fVar3 || bVar7) goto LAB_008295d6;
    if ((mask >> 0xe & 1) != 0) {
      getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,local_158);
      getDrawColorbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) goto LAB_008295d6;
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_008295d6;
    }
    pRVar23 = local_158;
    if ((mask >> 8 & 1) != 0) {
      getReadDepthbuffer((MultisamplePixelBufferAccess *)&src_1,local_158);
      getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) goto LAB_008295d6;
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_008295d6;
    }
    pRVar23 = local_158;
    if ((mask >> 10 & 1) != 0) {
      getReadStencilbuffer((MultisamplePixelBufferAccess *)&src_1,local_158);
      getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) {
LAB_008295d6:
        if (local_158->m_lastError == 0) {
          local_158->m_lastError = 0x502;
        }
        return;
      }
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_008295d6;
    }
  }
  if ((mask >> 0xe & 1) != 0) {
    getReadColorbuffer((MultisamplePixelBufferAccess *)&res,local_158);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    local_178.m_data[0] = (int)0.0;
    if (0 < (int)fVar25) {
      local_178.m_data[0] = (int)fVar25;
    }
    local_178.m_data[1] = (int)0.0;
    if (0 < (int)fVar22) {
      local_178.m_data[1] = (int)fVar22;
    }
    iVar9 = (int)fVar26 + (int)fVar25;
    if (src_1.m_access.m_size.m_data[1] <= (int)fVar26 + (int)fVar25) {
      iVar9 = src_1.m_access.m_size.m_data[1];
    }
    iVar10 = (int)fVar2 + (int)fVar22;
    if (src_1.m_access.m_size.m_data[2] <= (int)fVar2 + (int)fVar22) {
      iVar10 = src_1.m_access.m_size.m_data[2];
    }
    local_178.m_data[2] = iVar9 - local_178.m_data[0];
    if (local_178.m_data[2] < 1) {
      local_178.m_data[2] = 0;
    }
    local_178.m_data[3] = iVar10 - local_178.m_data[1];
    if (local_178.m_data[3] < 1) {
      local_178.m_data[3] = 0;
    }
  }
  pRVar23 = local_158;
  if ((mask >> 8 & 1) != 0) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&res,local_158);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    fVar22 = 0.0;
    if (0 < local_178.m_data[0]) {
      fVar22 = (float)local_178.m_data[0];
    }
    fVar25 = 0.0;
    if (0 < local_178.m_data[1]) {
      fVar25 = (float)local_178.m_data[1];
    }
    iVar9 = local_178.m_data[0] + local_178.m_data[2];
    if (src_1.m_access.m_size.m_data[1] <= local_178.m_data[0] + local_178.m_data[2]) {
      iVar9 = src_1.m_access.m_size.m_data[1];
    }
    iVar10 = local_178.m_data[1] + local_178.m_data[3];
    if (src_1.m_access.m_size.m_data[2] <= local_178.m_data[1] + local_178.m_data[3]) {
      iVar10 = src_1.m_access.m_size.m_data[2];
    }
    local_178.m_data[2] = iVar9 - (int)fVar22;
    if (local_178.m_data[2] < 1) {
      local_178.m_data[2] = 0;
    }
    local_178.m_data[3] = iVar10 - (int)fVar25;
    local_178.m_data[0] = (int)fVar22;
    local_178.m_data[1] = (int)fVar25;
    if (local_178.m_data[3] < 1) {
      local_178.m_data[3] = 0;
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    fVar22 = 0.0;
    if (0 < local_178.m_data[0]) {
      fVar22 = (float)local_178.m_data[0];
    }
    fVar25 = 0.0;
    if (0 < local_178.m_data[1]) {
      fVar25 = (float)local_178.m_data[1];
    }
    iVar9 = local_178.m_data[0] + local_178.m_data[2];
    if (src_1.m_access.m_size.m_data[1] <= local_178.m_data[0] + local_178.m_data[2]) {
      iVar9 = src_1.m_access.m_size.m_data[1];
    }
    iVar10 = local_178.m_data[1] + local_178.m_data[3];
    if (src_1.m_access.m_size.m_data[2] <= local_178.m_data[1] + local_178.m_data[3]) {
      iVar10 = src_1.m_access.m_size.m_data[2];
    }
    local_178.m_data[2] = iVar9 - (int)fVar22;
    if (local_178.m_data[2] < 1) {
      local_178.m_data[2] = 0;
    }
    local_178.m_data[3] = iVar10 - (int)fVar25;
    local_178.m_data[0] = (int)fVar22;
    local_178.m_data[1] = (int)fVar25;
    if (local_178.m_data[3] < 1) {
      local_178.m_data[3] = 0;
    }
  }
  if ((mask >> 0xe & 1) != 0) {
    getDrawColorbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar9 = 0;
    if (0 < local_188.m_data[0]) {
      iVar9 = local_188.m_data[0];
    }
    iVar10 = 0;
    if (0 < local_188.m_data[1]) {
      iVar10 = local_188.m_data[1];
    }
    iVar4 = local_188.m_data[0] + local_188.m_data[2];
    if (src_1.m_access.m_size.m_data[1] <= local_188.m_data[0] + local_188.m_data[2]) {
      iVar4 = src_1.m_access.m_size.m_data[1];
    }
    iVar5 = (int)fVar3 + local_188.m_data[1];
    if (src_1.m_access.m_size.m_data[2] <= (int)fVar3 + local_188.m_data[1]) {
      iVar5 = src_1.m_access.m_size.m_data[2];
    }
    local_188.m_data[2] = iVar4 - iVar9;
    if (local_188.m_data[2] < 1) {
      local_188.m_data[2] = 0;
    }
    local_188.m_data[3] = iVar5 - iVar10;
    local_188.m_data[0] = iVar9;
    local_188.m_data[1] = iVar10;
    if (local_188.m_data[3] < 1) {
      local_188.m_data[3] = 0;
    }
  }
  if ((mask >> 8 & 1) != 0) {
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar9 = 0;
    if (0 < local_188.m_data[0]) {
      iVar9 = local_188.m_data[0];
    }
    iVar10 = 0;
    if (0 < local_188.m_data[1]) {
      iVar10 = local_188.m_data[1];
    }
    iVar4 = local_188.m_data[0] + local_188.m_data[2];
    if (src_1.m_access.m_size.m_data[1] <= local_188.m_data[0] + local_188.m_data[2]) {
      iVar4 = src_1.m_access.m_size.m_data[1];
    }
    iVar5 = local_188.m_data[1] + local_188.m_data[3];
    if (src_1.m_access.m_size.m_data[2] <= local_188.m_data[1] + local_188.m_data[3]) {
      iVar5 = src_1.m_access.m_size.m_data[2];
    }
    local_188.m_data[2] = iVar4 - iVar9;
    if (local_188.m_data[2] < 1) {
      local_188.m_data[2] = 0;
    }
    local_188.m_data[3] = iVar5 - iVar10;
    local_188.m_data[0] = iVar9;
    local_188.m_data[1] = iVar10;
    if (local_188.m_data[3] < 1) {
      local_188.m_data[3] = 0;
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res,pRVar23);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar9 = 0;
    if (0 < local_188.m_data[0]) {
      iVar9 = local_188.m_data[0];
    }
    iVar10 = 0;
    if (0 < local_188.m_data[1]) {
      iVar10 = local_188.m_data[1];
    }
    iVar4 = local_188.m_data[0] + local_188.m_data[2];
    if (src_1.m_access.m_size.m_data[1] <= local_188.m_data[0] + local_188.m_data[2]) {
      iVar4 = src_1.m_access.m_size.m_data[1];
    }
    iVar5 = local_188.m_data[1] + local_188.m_data[3];
    if (src_1.m_access.m_size.m_data[2] <= local_188.m_data[1] + local_188.m_data[3]) {
      iVar5 = src_1.m_access.m_size.m_data[2];
    }
    local_188.m_data[2] = iVar4 - iVar9;
    if (local_188.m_data[2] < 1) {
      local_188.m_data[2] = 0;
    }
    local_188.m_data[3] = iVar5 - iVar10;
    local_188.m_data[0] = iVar9;
    local_188.m_data[1] = iVar10;
    if (local_188.m_data[3] < 1) {
      local_188.m_data[3] = 0;
    }
  }
  iVar5 = local_178.m_data[3];
  iVar4 = local_178.m_data[2];
  iVar9 = local_188.m_data[0];
  iVar10 = local_188.m_data[1];
  fVar22 = (float)local_188.m_data[2];
  fVar25 = (float)local_188.m_data[3];
  if (pRVar23->m_scissorEnabled == true) {
    iVar16 = (pRVar23->m_scissorBox).m_data[0];
    iVar11 = (pRVar23->m_scissorBox).m_data[1];
    iVar9 = iVar16;
    if (iVar16 < local_188.m_data[0]) {
      iVar9 = local_188.m_data[0];
    }
    iVar10 = iVar11;
    if (iVar11 < local_188.m_data[1]) {
      iVar10 = local_188.m_data[1];
    }
    iVar16 = iVar16 + (pRVar23->m_scissorBox).m_data[2];
    if (local_188.m_data[0] + local_188.m_data[2] < iVar16) {
      iVar16 = local_188.m_data[0] + local_188.m_data[2];
    }
    iVar11 = iVar11 + (pRVar23->m_scissorBox).m_data[3];
    if (local_188.m_data[1] + local_188.m_data[3] < iVar11) {
      iVar11 = local_188.m_data[1] + local_188.m_data[3];
    }
    fVar22 = (float)(iVar16 - iVar9);
    if (iVar16 - iVar9 < 1) {
      fVar22 = 0.0;
    }
    fVar25 = (float)(iVar11 - iVar10);
    if (iVar11 - iVar10 < 1) {
      fVar25 = 0.0;
    }
  }
  if ((float)local_178.m_data[3] == 0.0 || (float)local_178.m_data[2] == 0.0) {
    return;
  }
  if (fVar25 == 0.0 || fVar22 == 0.0) {
    return;
  }
  local_188.m_data[0] = iVar9;
  local_188.m_data[1] = iVar10;
  local_188.m_data[2] = (int)fVar22;
  local_188.m_data[3] = (int)fVar25;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,pRVar23);
  if (src_1.m_access.m_size.m_data[0] != 1) {
    blitResolveMultisampleFramebuffer
              (pRVar23,mask,&local_178,&local_188,(int)local_164 < srcX0 != dstX1 < (int)local_14c,
               (int)local_150 < srcY0 != dstY1 < dstY0);
    return;
  }
  local_164 = (float)local_178.m_data[0];
  local_150 = (float)local_178.m_data[1];
  pfVar13 = (float *)&res;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[2] = 0.0;
  stack0xfffffffffffffed8 = (void *)((ulong)stack0xfffffffffffffed8 & 0xffffffff00000000);
  lVar17 = 0;
  lVar19 = 0;
  do {
    lVar20 = 0;
    do {
      uVar27 = 0x3f800000;
      if (lVar17 != lVar20) {
        uVar27 = 0;
      }
      *(undefined4 *)((long)pfVar13 + lVar20) = uVar27;
      lVar20 = lVar20 + 0xc;
    } while (lVar20 != 0x24);
    lVar19 = lVar19 + 1;
    pfVar13 = pfVar13 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar19 != 3);
  res.m_data.m_data[2].m_data[0] = (float)(srcX0 - local_178.m_data[0]);
  res.m_data.m_data[2].m_data[1] = (float)(srcY0 - local_178.m_data[1]);
  local_78.m_data[1] = (float)(int)local_15c / (float)(int)fVar21;
  local_78.m_data[0] = (float)(int)local_160 / (float)(int)local_168;
  local_78.m_data[2] = 1.0;
  pCVar14 = (ChannelType *)&dst;
  dst.super_ConstPixelBufferAccess.m_format.order = R;
  dst.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  dst.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  dst.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  dst.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  dst.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  dst.super_ConstPixelBufferAccess.m_data =
       (void *)((ulong)dst.super_ConstPixelBufferAccess.m_data & 0xffffffff00000000);
  lVar17 = 0;
  lVar19 = 0;
  do {
    lVar20 = 0;
    do {
      fVar21 = 0.0;
      if (lVar17 == lVar20) {
        fVar21 = local_78.m_data[lVar19];
      }
      *(float *)((long)pCVar14 + lVar20) = fVar21;
      lVar20 = lVar20 + 0xc;
    } while (lVar20 != 0x24);
    lVar19 = lVar19 + 1;
    pCVar14 = pCVar14 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar19 != 3);
  tcu::operator*((Matrix<float,_3,_3> *)&src_1,&res,(Matrix<float,_3,_3> *)&dst);
  iVar10 = local_188.m_data[1];
  iVar9 = local_188.m_data[0];
  pfVar13 = (float *)&res_1;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar17 = 0;
  lVar19 = 0;
  do {
    lVar20 = 0;
    do {
      uVar27 = 0x3f800000;
      if (lVar17 != lVar20) {
        uVar27 = 0;
      }
      *(undefined4 *)((long)pfVar13 + lVar20) = uVar27;
      lVar20 = lVar20 + 0xc;
    } while (lVar20 != 0x24);
    lVar19 = lVar19 + 1;
    pfVar13 = pfVar13 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar19 != 3);
  res_1.m_data.m_data[2].m_data[0] = (float)(local_188.m_data[0] - (int)local_14c);
  res_1.m_data.m_data[2].m_data[1] = (float)(local_188.m_data[1] - dstY0);
  tcu::operator*(&transform,(Matrix<float,_3,_3> *)&src_1,&res_1);
  if ((mask >> 0xe & 1) == 0) goto LAB_0082a367;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
  rr::MultisamplePixelBufferAccess::toSinglesampleAccess
            (&dst,(MultisamplePixelBufferAccess *)&res_1);
  tcu::getSubregion((PixelBufferAccess *)&src_1,&dst,(int)local_164,(int)local_150,iVar4,iVar5);
  res.m_data.m_data[0].m_data[2] = (float)src_1.m_access.m_size.m_data[0];
  res.m_data.m_data[1].m_data[0] = (float)src_1.m_access.m_size.m_data[1];
  res.m_data.m_data[0].m_data[0] = (float)src_1.m_access.m_format.order;
  res.m_data.m_data[0].m_data[1] = (float)src_1.m_access.m_format.type;
  res.m_data.m_data[1].m_data[1] = (float)src_1.m_access.m_size.m_data[2];
  res.m_data.m_data[1].m_data[2] = (float)src_1.m_access.m_pitch.m_data[0];
  res.m_data.m_data[2].m_data[0] = (float)src_1.m_access.m_pitch.m_data[1];
  res.m_data.m_data[2].m_data[1] = (float)src_1.m_access.m_pitch.m_data[2];
  unique0x10000c33 = (void *)CONCAT44(src_1.m_access.m_data._4_4_,src_1.m_access.m_data._0_4_);
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
  rr::MultisamplePixelBufferAccess::toSinglesampleAccess
            ((PixelBufferAccess *)&src_1,(MultisamplePixelBufferAccess *)&res_1);
  tcu::getSubregion(&dst,(PixelBufferAccess *)&src_1,iVar9,iVar10,(int)fVar22,(int)fVar25);
  TVar12 = tcu::getTextureChannelClass(dst.super_ConstPixelBufferAccess.m_format.type);
  src_1.m_access.m_format.order = R;
  src_1.m_access.m_format.type = SNORM_INT8;
  src_1.m_access.m_size.m_data[0] = 0;
  src_1.m_access.m_size.m_data[1] = (int)(filter == 0x2601 && (fVar2 != fVar3 || bVar7));
  src_1.m_access.m_pitch.m_data[0] = 0;
  src_1.m_access.m_pitch.m_data[1] = src_1.m_access.m_pitch.m_data[1] & 0xffffff00;
  src_1.m_access.m_pitch.m_data[2] = 0;
  src_1.m_access.m_data._0_4_ = 0;
  src_1.m_access.m_data._4_4_ = 0;
  src_1.m_access.m_size.m_data[2] = src_1.m_access.m_size.m_data[1];
  bVar7 = tcu::isSRGB((TextureFormat)res.m_data.m_data[0].m_data._0_8_);
  format.type = dst.super_ConstPixelBufferAccess.m_format.type;
  format.order = dst.super_ConstPixelBufferAccess.m_format.order;
  bVar8 = tcu::isSRGB(format);
  bVar24 = ((pRVar23->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0 &
           pRVar23->m_sRGBUpdateEnabled;
  if (bVar24 == 0) {
    if (res.m_data.m_data[0].m_data[0] == 2.10195e-44) {
      uVar15 = 8;
LAB_0082a056:
      uVar18 = (ulong)res.m_data.m_data[0].m_data._0_8_ >> 0x20;
    }
    else {
      if (res.m_data.m_data[0].m_data[0] == 1.96182e-44) {
        uVar15 = 7;
        goto LAB_0082a056;
      }
      uVar15 = res.m_data.m_data[0].m_data._0_8_ & 0xffffffff;
      uVar18 = (ulong)res.m_data.m_data[0].m_data._0_8_ >> 0x20;
    }
    local_78.m_data._0_8_ = uVar18 << 0x20 | uVar15;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res_1,(TextureFormat *)&local_78,
               (int)res.m_data.m_data[0].m_data[2],(int)res.m_data.m_data[1].m_data[0],
               (int)res.m_data.m_data[1].m_data[1],(int)res.m_data.m_data[2].m_data[0],
               (int)res.m_data.m_data[2].m_data[1],stack0xfffffffffffffed8);
    unique0x10000c53 = (void *)CONCAT44(uStack_84,res_1.m_data.m_data[2].m_data[2]);
    res.m_data.m_data[1].m_data[1] = res_1.m_data.m_data[1].m_data[1];
    res.m_data.m_data[1].m_data[2] = res_1.m_data.m_data[1].m_data[2];
    res.m_data.m_data[2].m_data[0] = res_1.m_data.m_data[2].m_data[0];
    res.m_data.m_data[2].m_data[1] = res_1.m_data.m_data[2].m_data[1];
    res.m_data.m_data[0].m_data[0] = res_1.m_data.m_data[0].m_data[0];
    res.m_data.m_data[0].m_data[1] = res_1.m_data.m_data[0].m_data[1];
    res.m_data.m_data[0].m_data[2] = res_1.m_data.m_data[0].m_data[2];
    res.m_data.m_data[1].m_data[0] = res_1.m_data.m_data[1].m_data[0];
    if (dst.super_ConstPixelBufferAccess.m_format.order == sRGBA) {
      uVar15 = 8;
    }
    else if (dst.super_ConstPixelBufferAccess.m_format.order == sRGB) {
      uVar15 = 7;
    }
    else {
      uVar15 = (ulong)dst.super_ConstPixelBufferAccess.m_format.order;
    }
    local_78.m_data._0_8_ = (ulong)dst.super_ConstPixelBufferAccess.m_format.type << 0x20 | uVar15;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res_1,(TextureFormat *)&local_78,
               dst.super_ConstPixelBufferAccess.m_size.m_data[0],
               dst.super_ConstPixelBufferAccess.m_size.m_data[1],
               dst.super_ConstPixelBufferAccess.m_size.m_data[2],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[1],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[2],
               dst.super_ConstPixelBufferAccess.m_data);
    dst.super_ConstPixelBufferAccess.m_data =
         (void *)CONCAT44(uStack_84,res_1.m_data.m_data[2].m_data[2]);
    dst.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)res_1.m_data.m_data[0].m_data[2];
    dst.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)res_1.m_data.m_data[1].m_data[0];
    dst.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)res_1.m_data.m_data[1].m_data[1];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)res_1.m_data.m_data[1].m_data[2];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)res_1.m_data.m_data[2].m_data[0];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)res_1.m_data.m_data[2].m_data[1];
    dst.super_ConstPixelBufferAccess.m_format.order = res_1.m_data.m_data[0].m_data[0];
    dst.super_ConstPixelBufferAccess.m_format.type = res_1.m_data.m_data[0].m_data[1];
  }
  iVar9 = local_188.m_data[2];
  local_14c = (float)local_188.m_data[3];
  pRVar23 = local_158;
  if (0 < local_188.m_data[3]) {
    local_15c = (float)local_178.m_data[2];
    local_160 = (float)local_178.m_data[3];
    fVar21 = 0.0;
    do {
      if (0 < iVar9) {
        local_168 = (float)(int)fVar21 + 0.5;
        fVar22 = 0.0;
        local_150 = fVar21;
        do {
          fVar25 = transform.m_data.m_data[0].m_data[0] * ((float)(int)fVar22 + 0.5) +
                   transform.m_data.m_data[1].m_data[0] * local_168 +
                   transform.m_data.m_data[2].m_data[0];
          if (((0.0 <= fVar25) && (fVar25 < local_15c)) &&
             ((fVar26 = ((float)(int)fVar22 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                        transform.m_data.m_data[1].m_data[1] * local_168 +
                        transform.m_data.m_data[2].m_data[1], 0.0 <= fVar26 && (fVar26 < local_160))
             )) {
            if ((filter == 1 || bVar7) ||
                (TVar12 < TEXTURECHANNELCLASS_LAST & 0x13U >> ((byte)TVar12 & 0x1f)) != 0) {
              tcu::ConstPixelBufferAccess::sample2D
                        ((ConstPixelBufferAccess *)&res_1,(Sampler *)&res,(FilterMode)&src_1,fVar25,
                         fVar26,src_1.m_access.m_size.m_data[1]);
              if ((bVar8 & bVar24) == 0) {
                local_78.m_data[0] = res_1.m_data.m_data[0].m_data[0];
                local_78.m_data[1] = res_1.m_data.m_data[0].m_data[1];
                local_78.m_data[2] = res_1.m_data.m_data[0].m_data[2];
                local_78.m_data[3] = res_1.m_data.m_data[1].m_data[0];
              }
              else {
                tcu::linearToSRGB((tcu *)&local_78,(Vec4 *)&res_1);
              }
              tcu::PixelBufferAccess::setPixel(&dst,&local_78,(int)fVar22,(int)fVar21,0);
            }
            else {
              local_164 = fVar26;
              fVar25 = floorf(fVar25);
              fVar26 = floorf(local_164);
              fVar21 = local_150;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&res_1,(int)&res,(int)fVar25,(int)fVar26);
              tcu::PixelBufferAccess::setPixel(&dst,(IVec4 *)&res_1,(int)fVar22,(int)fVar21,0);
            }
          }
          fVar22 = (float)((int)fVar22 + 1);
        } while ((float)iVar9 != fVar22);
      }
      fVar21 = (float)((int)fVar21 + 1);
      pRVar23 = local_158;
    } while (fVar21 != local_14c);
  }
LAB_0082a367:
  if (((mask >> 8 & 1) != 0) && (pRVar23->m_depthMask == true)) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                     local_178.m_data[0],local_178.m_data[1],local_178.m_data[2],local_178.m_data[3]
                    );
    getDepthMultisampleAccess
              ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
    iVar9 = local_188.m_data[2];
    local_160 = (float)local_188.m_data[3];
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                     local_188.m_data[0],local_188.m_data[1],local_188.m_data[2],local_188.m_data[3]
                    );
    getDepthMultisampleAccess
              ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
    pRVar23 = local_158;
    if (0 < (int)local_160) {
      fVar21 = 0.0;
      do {
        if (0 < iVar9) {
          local_168 = (float)(int)fVar21 + 0.5;
          fVar22 = 0.0;
          do {
            local_15c = (float)(int)fVar22 + 0.5;
            fVar25 = floorf(transform.m_data.m_data[0].m_data[0] * local_15c +
                            transform.m_data.m_data[1].m_data[0] * local_168 +
                            transform.m_data.m_data[2].m_data[0]);
            fVar26 = floorf(local_15c * transform.m_data.m_data[0].m_data[1] +
                            transform.m_data.m_data[1].m_data[1] * local_168 +
                            transform.m_data.m_data[2].m_data[1]);
            fVar25 = tcu::ConstPixelBufferAccess::getPixDepth
                               (&src_1.m_access,0,(int)fVar25,(int)fVar26);
            tcu::PixelBufferAccess::setPixDepth
                      ((PixelBufferAccess *)&res,fVar25,0,(int)fVar22,(int)fVar21);
            fVar22 = (float)((int)fVar22 + 1);
          } while ((float)iVar9 != fVar22);
        }
        fVar21 = (float)((int)fVar21 + 1);
        pRVar23 = local_158;
      } while (fVar21 != local_160);
    }
  }
  if ((mask >> 10 & 1) == 0) {
    return;
  }
  getReadStencilbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
  rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                   local_178.m_data[0],local_178.m_data[1],local_178.m_data[2],local_178.m_data[3]);
  getStencilMultisampleAccess
            ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&src_1,(MultisamplePixelBufferAccess *)&res);
  getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res_1,pRVar23);
  local_15c = (float)local_188.m_data[2];
  local_164 = (float)local_188.m_data[3];
  rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                   local_188.m_data[0],local_188.m_data[1],local_188.m_data[2],local_188.m_data[3]);
  getStencilMultisampleAccess
            ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
  if ((int)local_164 < 1) {
    return;
  }
  fVar21 = 0.0;
  do {
    if (0 < (int)local_15c) {
      local_160 = (float)(int)fVar21 + 0.5;
      fVar22 = 0.0;
      do {
        local_168 = ((float)(int)fVar22 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                    transform.m_data.m_data[1].m_data[1] * local_160 +
                    transform.m_data.m_data[2].m_data[1];
        fVar25 = floorf(transform.m_data.m_data[0].m_data[0] * ((float)(int)fVar22 + 0.5) +
                        transform.m_data.m_data[1].m_data[0] * local_160 +
                        transform.m_data.m_data[2].m_data[0]);
        floorf(local_168);
        tcu::ConstPixelBufferAccess::getPixelInt
                  (&dst.super_ConstPixelBufferAccess,(int)&src_1,0,(int)fVar25);
        CVar6 = dst.super_ConstPixelBufferAccess.m_format.order;
        CVar1 = local_158->m_stencil[0].writeMask;
        tcu::ConstPixelBufferAccess::getPixelInt
                  (&dst.super_ConstPixelBufferAccess,(int)(PixelBufferAccess *)&res,0,(int)fVar22);
        dst.super_ConstPixelBufferAccess.m_format.order =
             (CVar6 ^ dst.super_ConstPixelBufferAccess.m_format.order) & CVar1 ^
             dst.super_ConstPixelBufferAccess.m_format.order;
        dst.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        dst.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        dst.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&res,(IVec4 *)&dst.super_ConstPixelBufferAccess,0,
                   (int)fVar22,(int)fVar21);
        fVar22 = (float)((int)fVar22 + 1);
      } while (local_15c != fVar22);
    }
    fVar21 = (float)((int)fVar21 + 1);
  } while (fVar21 != local_164);
  return;
}

Assistant:

void ReferenceContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	// p0 in inclusive, p1 exclusive.
	// Negative width/height means swap.
	bool	swapSrcX	= srcX1 < srcX0;
	bool	swapSrcY	= srcY1 < srcY0;
	bool	swapDstX	= dstX1 < dstX0;
	bool	swapDstY	= dstY1 < dstY0;
	int		srcW		= de::abs(srcX1-srcX0);
	int		srcH		= de::abs(srcY1-srcY0);
	int		dstW		= de::abs(dstX1-dstX0);
	int		dstH		= de::abs(dstY1-dstY0);
	bool	scale		= srcW != dstW || srcH != dstH;
	int		srcOriginX	= swapSrcX ? srcX1 : srcX0;
	int		srcOriginY	= swapSrcY ? srcY1 : srcY0;
	int		dstOriginX	= swapDstX ? dstX1 : dstX0;
	int		dstOriginY	= swapDstY ? dstY1 : dstY0;
	IVec4	srcRect		= IVec4(srcOriginX, srcOriginY, srcW, srcH);
	IVec4	dstRect		= IVec4(dstOriginX, dstOriginY, dstW, dstH);

	RC_IF_ERROR(filter != GL_NEAREST && filter != GL_LINEAR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((mask & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0 && filter != GL_NEAREST, GL_INVALID_OPERATION, RC_RET_VOID);

	// Validate that both targets are complete.
	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE ||
				checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check samples count is valid
	RC_IF_ERROR(getDrawColorbuffer().getNumSamples() != 1, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check size restrictions of multisampled case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		// Src and Dst rect dimensions must be the same
		RC_IF_ERROR(srcW != dstW || srcH != dstH, GL_INVALID_OPERATION, RC_RET_VOID);

		// Framebuffer formats must match
		if (mask & GL_COLOR_BUFFER_BIT)		RC_IF_ERROR(getReadColorbuffer().raw().getFormat()   != getDrawColorbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_DEPTH_BUFFER_BIT)		RC_IF_ERROR(getReadDepthbuffer().raw().getFormat()   != getDrawDepthbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_STENCIL_BUFFER_BIT)	RC_IF_ERROR(getReadStencilbuffer().raw().getFormat() != getDrawStencilbuffer().raw().getFormat(), GL_INVALID_OPERATION, RC_RET_VOID);
	}

	// Compute actual source rect.
	srcRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadColorbuffer()))	: srcRect;
	srcRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadDepthbuffer()))	: srcRect;
	srcRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(srcRect, getBufferRect(getReadStencilbuffer()))	: srcRect;

	// Compute destination rect.
	dstRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawColorbuffer()))	: dstRect;
	dstRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawDepthbuffer()))	: dstRect;
	dstRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(dstRect, getBufferRect(getDrawStencilbuffer()))	: dstRect;
	dstRect = m_scissorEnabled					? intersect(dstRect, m_scissorBox)							: dstRect;

	if (isEmpty(srcRect) || isEmpty(dstRect))
		return; // Don't attempt copy.

	// Multisampled read buffer is a special case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		deUint32 error = blitResolveMultisampleFramebuffer(mask, srcRect, dstRect, swapSrcX ^ swapDstX, swapSrcY ^ swapDstY);

		if (error != GL_NO_ERROR)
			setError(error);

		return;
	}

	// \note Multisample pixel buffers can now be accessed like non-multisampled because multisample read buffer case is already handled. => sample count must be 1

	// Coordinate transformation:
	// Dst offset space -> dst rectangle space -> src rectangle space -> src offset space.
	tcu::Mat3 transform = tcu::translationMatrix(Vec2((float)(srcX0 - srcRect.x()), (float)(srcY0 - srcRect.y())))
						* tcu::Mat3(Vec3((float)(srcX1-srcX0) / (float)(dstX1-dstX0),
										 (float)(srcY1-srcY0) / (float)(dstY1-dstY0),
										 1.0f))
						* tcu::translationMatrix(Vec2((float)(dstRect.x() - dstX0), (float)(dstRect.y() - dstY0)));

	if (mask & GL_COLOR_BUFFER_BIT)
	{
		tcu::ConstPixelBufferAccess		src			= tcu::getSubregion(getReadColorbuffer().toSinglesampleAccess(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess			dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass		dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool							dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
													  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
													  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		tcu::Sampler::FilterMode		sFilter		= (scale && filter == GL_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;
		tcu::Sampler					sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
													 sFilter, sFilter, 0.0f /* lod threshold */, false /* non-normalized coords */);
		bool							srcIsSRGB	= tcu::isSRGB(src.getFormat());
		bool							dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool						convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			src	= tcu::ConstPixelBufferAccess	(toNonSRGBFormat(src.getFormat()), src.getWidth(), src.getHeight(), src.getDepth(), src.getRowPitch(), src.getSlicePitch(), src.getDataPtr());
			dst	= tcu::PixelBufferAccess		(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		// \note We don't check for unsupported conversions, unlike spec requires.

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;

				// \note Only affine part is used.
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				// do not copy pixels outside the modified source region (modified by buffer intersection)
				if (sX < 0.0f || sX >= (float)srcRect.z() ||
					sY < 0.0f || sY >= (float)srcRect.w())
					continue;

				if (dstIsFloat || srcIsSRGB || filter == tcu::Sampler::LINEAR)
				{
					Vec4 p = src.sample2D(sampler, sampler.minFilter, sX, sY, 0);
					dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, xo, yo);
				}
				else
					dst.setPixel(src.getPixelInt(deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)), xo, yo);
			}
		}
	}

	if ((mask & GL_DEPTH_BUFFER_BIT) && m_depthMask)
	{
		rr::MultisampleConstPixelBufferAccess	src		= getDepthMultisampleAccess(rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst		= getDepthMultisampleAccess(rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int sampleNdx = 0; // multisample read buffer case is already handled

				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				writeDepthOnly(dst, sampleNdx, xo, yo, src.raw().getPixDepth(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)));
			}
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int	sampleNdx = 0; // multisample read buffer case is already handled

				float		dX			= (float)xo + 0.5f;
				float		dY			= (float)yo + 0.5f;
				float		sX			= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float		sY			= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);
				deUint32	srcStencil	= src.raw().getPixelUint(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)).x();

				writeMaskedStencil(dst, sampleNdx, xo, yo, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
			}
		}
	}
}